

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

art_node_t * art_node4_insert(art_node4_t *node,art_node_t *child,uint8_t key)

{
  byte bVar1;
  art_node16_t *node_00;
  art_node_t *paVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)node->count;
  if (3 < uVar6) {
    bVar1 = (node->base).prefix_size;
    node_00 = (art_node16_t *)roaring_malloc(0x98);
    (node_00->base).typecode = '\x01';
    (node_00->base).prefix_size = bVar1;
    memcpy((node_00->base).prefix,(node->base).prefix,(ulong)bVar1);
    node_00->count = '\0';
    lVar3 = 2;
    do {
      art_node16_insert(node_00,*(art_node_t **)((long)&node->base + lVar3 * 8),
                        (node->base).prefix[lVar3 + 4]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    roaring_free(node);
    paVar2 = art_node16_insert(node_00,child,key);
    return paVar2;
  }
  uVar4 = 0;
  uVar5 = uVar4;
  if (uVar6 != 0) {
    do {
      uVar5 = uVar4;
      if (key < node->keys[uVar4]) break;
      uVar4 = uVar4 + 1;
      uVar5 = uVar6;
    } while (uVar6 != uVar4);
  }
  memmove(node->keys + uVar5 + 1,node->keys + uVar5,uVar6 - uVar5);
  memmove(node->children + uVar5 + 1,node->children + uVar5,(uVar6 - uVar5) * 8);
  node->children[uVar5] = child;
  node->keys[uVar5] = key;
  node->count = node->count + '\x01';
  return (art_node_t *)node;
}

Assistant:

static art_node_t *art_node4_insert(art_node4_t *node, art_node_t *child,
                                    uint8_t key) {
    if (node->count < 4) {
        size_t idx = 0;
        for (; idx < node->count; ++idx) {
            if (node->keys[idx] > key) {
                break;
            }
        }
        size_t after = node->count - idx;
        // Shift other keys to maintain sorted order.
        memmove(node->keys + idx + 1, node->keys + idx,
                after * sizeof(art_key_chunk_t));
        memmove(node->children + idx + 1, node->children + idx,
                after * sizeof(art_node_t *));

        node->children[idx] = child;
        node->keys[idx] = key;
        node->count++;
        return (art_node_t *)node;
    }
    art_node16_t *new_node =
        art_node16_create(node->base.prefix, node->base.prefix_size);
    // Instead of calling insert, this could be specialized to 2x memcpy and
    // setting the count.
    for (size_t i = 0; i < 4; ++i) {
        art_node16_insert(new_node, node->children[i], node->keys[i]);
    }
    roaring_free(node);
    return art_node16_insert(new_node, child, key);
}